

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O3

void glist_readfrombinbuf(_glist *x,_binbuf *b,char *filename,int selectem)

{
  word wVar1;
  t_atomtype *ptVar2;
  undefined4 uVar3;
  _glist *x_00;
  uint natoms;
  int iVar4;
  _glist *in_RAX;
  t_atom *ptVar5;
  t_atom *ptVar6;
  t_template *x1;
  t_template *x2;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  t_atom *ptVar13;
  uint uVar14;
  uint uVar15;
  uint local_74;
  t_atom *local_70;
  t_atom *local_68;
  t_symbol *local_60;
  int local_54;
  t_atom *local_50;
  long local_48;
  _glist *local_40;
  word *local_38;
  
  glist_getcanvas(in_RAX);
  local_74 = 0;
  natoms = binbuf_getnatom(b);
  uVar8 = (ulong)natoms;
  local_70 = binbuf_getvec(b);
  if ((int)natoms < 1) {
    uVar15 = 0;
LAB_00150eb5:
    if (local_70->a_type == A_SYMBOL) goto LAB_00150ef8;
  }
  else {
    uVar15 = 1;
    if (local_70->a_type != A_SEMI) {
      uVar7 = 0;
      ptVar6 = local_70;
      do {
        ptVar6 = ptVar6 + 1;
        if (uVar8 - 1 == uVar7) {
          uVar15 = 0;
          goto LAB_00150ead;
        }
        uVar7 = uVar7 + 1;
      } while (ptVar6->a_type != A_SEMI);
      uVar15 = (uint)(uVar7 < uVar8);
      uVar8 = uVar7;
LAB_00150ead:
      uVar15 = uVar15 + (int)uVar8;
      if ((int)uVar8 == 1) goto LAB_00150ef8;
      goto LAB_00150eb5;
    }
  }
  iVar4 = strcmp(((local_70->a_w).w_symbol)->s_name,"data");
  if (iVar4 != 0) {
    pd_error(x,"%s: file apparently of wrong type",filename);
    return;
  }
LAB_00150ef8:
  local_54 = selectem;
  local_40 = x;
  ptVar5 = (t_atom *)getbytes(0);
  ptVar6 = local_70;
  uVar12 = uVar15;
  if ((int)uVar15 < (int)natoms) {
    local_38 = &local_70[1].a_w;
    local_48 = (long)(int)natoms;
    local_50 = local_70 + 1;
    do {
      lVar9 = (long)(int)uVar15;
      uVar12 = 1;
      uVar11 = uVar15;
      if (ptVar6[lVar9].a_type != A_SEMI) {
        ptVar13 = local_50 + lVar9;
        lVar10 = lVar9;
        uVar12 = uVar15;
        do {
          lVar10 = lVar10 + 1;
          uVar11 = natoms;
          if (natoms - 1 == uVar12) break;
          uVar11 = uVar12 + 1;
          ptVar2 = &ptVar13->a_type;
          ptVar13 = ptVar13 + 1;
          uVar12 = uVar11;
        } while (*ptVar2 != A_SEMI);
        uVar12 = (uint)(lVar10 < local_48);
      }
      uVar12 = uVar12 + uVar11;
      iVar4 = uVar11 - uVar15;
      if (iVar4 < 2) break;
      local_68 = ptVar5;
      if (iVar4 == 2) {
        if (ptVar6[lVar9].a_type == A_SYMBOL) {
          iVar4 = strcmp((ptVar6[lVar9].a_w.w_symbol)->s_name,"template");
          if ((iVar4 == 0) && (ptVar6[lVar9 + 1].a_type == A_SYMBOL)) goto LAB_00151002;
        }
        canvas_readerror((int)ptVar6,(t_atom *)(ulong)uVar15,2,0x1b80f4,(char *)ptVar5);
        uVar15 = uVar12;
      }
      else {
        canvas_readerror((int)ptVar6,(t_atom *)(ulong)uVar15,iVar4,0x1b80e0,(char *)ptVar5);
LAB_00151002:
        local_60 = canvas_makebindsym(local_38[lVar9 * 2].w_symbol);
        uVar8 = 0;
        ptVar6 = local_68;
        uVar15 = uVar12;
        if ((int)uVar12 < (int)natoms) {
          uVar11 = 0;
          do {
            lVar9 = (long)(int)uVar12;
            uVar15 = 1;
            uVar14 = uVar12;
            if (local_70[lVar9].a_type != A_SEMI) {
              ptVar5 = local_50 + lVar9;
              lVar10 = lVar9;
              uVar15 = uVar12;
              do {
                lVar10 = lVar10 + 1;
                uVar14 = natoms;
                if (natoms - 1 == uVar15) break;
                uVar14 = uVar15 + 1;
                ptVar2 = &ptVar5->a_type;
                ptVar5 = ptVar5 + 1;
                uVar15 = uVar14;
              } while (*ptVar2 != A_SEMI);
              uVar15 = (uint)(lVar10 < local_48);
            }
            uVar15 = uVar15 + uVar14;
            iVar4 = uVar14 - uVar12;
            if (iVar4 - 4U < 0xfffffffe) {
              uVar8 = (ulong)uVar11;
              break;
            }
            ptVar13 = local_70 + lVar9;
            uVar8 = (ulong)(iVar4 + uVar11);
            uVar7 = (ulong)uVar11;
            ptVar6 = (t_atom *)resizebytes(ptVar6,uVar7 * 0x10,uVar8 << 4);
            uVar3 = *(undefined4 *)&ptVar13->field_0x4;
            wVar1 = ptVar13->a_w;
            ptVar5 = ptVar6 + uVar7;
            ptVar5->a_type = ptVar13->a_type;
            *(undefined4 *)&ptVar5->field_0x4 = uVar3;
            ptVar5->a_w = wVar1;
            uVar3 = *(undefined4 *)&ptVar13[1].field_0x4;
            wVar1 = ptVar13[1].a_w;
            ptVar5 = ptVar6 + uVar7 + 1;
            ptVar5->a_type = ptVar13[1].a_type;
            *(undefined4 *)&ptVar5->field_0x4 = uVar3;
            ptVar5->a_w = wVar1;
            if (iVar4 == 3) {
              uVar3 = *(undefined4 *)&ptVar13[2].field_0x4;
              wVar1 = ptVar13[2].a_w;
              ptVar6[uVar7 + 2].a_type = ptVar13[2].a_type;
              *(undefined4 *)&ptVar6[uVar7 + 2].field_0x4 = uVar3;
              ptVar6[uVar7 + 2].a_w = wVar1;
            }
            uVar12 = uVar15;
            uVar11 = iVar4 + uVar11;
          } while ((int)uVar15 < (int)natoms);
        }
        local_68 = ptVar6;
        x1 = template_findbyname(local_60);
        ptVar6 = local_68;
        if (x1 == (t_template *)0x0) {
          pd_error((void *)0x0,"%s: template not found in current patch",local_60->s_name);
          freebytes(local_68,uVar8 << 4);
          return;
        }
        x2 = template_new(local_60,(int)uVar8,local_68);
        freebytes(ptVar6,uVar8 << 4);
        iVar4 = template_match(x1,x2);
        if (iVar4 == 0) {
          pd_error((void *)0x0,"%s: template doesn\'t match current one",local_60->s_name);
          pd_free(&x2->t_pdobj);
          return;
        }
        pd_free(&x2->t_pdobj);
        ptVar6 = local_70;
      }
      ptVar5 = (t_atom *)getbytes(0);
      uVar12 = uVar15;
    } while ((int)uVar15 < (int)natoms);
  }
  local_74 = uVar12;
  freebytes(ptVar5,0);
  x_00 = local_40;
  iVar4 = local_54;
  if ((int)uVar12 < (int)natoms) {
    do {
      canvas_readscalar(x_00,natoms,ptVar6,(int *)&local_74,iVar4);
    } while ((int)local_74 < (int)natoms);
  }
  return;
}

Assistant:

void glist_readfrombinbuf(t_glist *x, const t_binbuf *b, const char *filename, int selectem)
{
    t_canvas *canvas = glist_getcanvas(x);
    int natoms, nline, message, nextmsg = 0;
    t_atom *vec;

    natoms = binbuf_getnatom(b);
    vec = binbuf_getvec(b);


            /* check for file type */
    nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
    if (nline != 1 && vec[message].a_type != A_SYMBOL &&
        strcmp(vec[message].a_w.w_symbol->s_name, "data"))
    {
        pd_error(x, "%s: file apparently of wrong type", filename);
        return;
    }
        /* read in templates and check for consistency */
    while (1)
    {
        t_template *newtemplate, *existtemplate;
        t_symbol *templatesym;
        t_atom *templateargs = getbytes(0);
        int ntemplateargs = 0, newnargs;
        nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
        if (nline < 2)
        {
            t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
            break;
        }
        else if (nline > 2)
            canvas_readerror(natoms, vec, message, nline,
                "extra items ignored");
        else if (vec[message].a_type != A_SYMBOL ||
            strcmp(vec[message].a_w.w_symbol->s_name, "template") ||
            vec[message + 1].a_type != A_SYMBOL)
        {
            canvas_readerror(natoms, vec, message, nline,
                "bad template header");
            continue;
        }
        templatesym = canvas_makebindsym(vec[message + 1].a_w.w_symbol);
        while (1)
        {
            nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
            if (nline != 2 && nline != 3)
                break;
            newnargs = ntemplateargs + nline;
            templateargs = (t_atom *)t_resizebytes(templateargs,
                sizeof(*templateargs) * ntemplateargs,
                sizeof(*templateargs) * newnargs);
            templateargs[ntemplateargs] = vec[message];
            templateargs[ntemplateargs + 1] = vec[message + 1];
            if (nline == 3)
                templateargs[ntemplateargs + 2] = vec[message + 2];
            ntemplateargs = newnargs;
        }
        if (!(existtemplate = template_findbyname(templatesym)))
        {
            pd_error(0, "%s: template not found in current patch",
                templatesym->s_name);
            t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
            return;
        }
        newtemplate = template_new(templatesym, ntemplateargs, templateargs);
        t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
        if (!template_match(existtemplate, newtemplate))
        {
            pd_error(0, "%s: template doesn't match current one",
                templatesym->s_name);
            pd_free(&newtemplate->t_pdobj);
            return;
        }
        pd_free(&newtemplate->t_pdobj);
    }
    while (nextmsg < natoms)
    {
        canvas_readscalar(x, natoms, vec, &nextmsg, selectem);
    }
}